

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

void * resampler_create(void)

{
  resampler *r;
  undefined4 *local_8;
  
  local_8 = (undefined4 *)malloc(0x3c8);
  if (local_8 == (undefined4 *)0x0) {
    local_8 = (undefined4 *)0x0;
  }
  else {
    *local_8 = 0xf;
    local_8[1] = 0;
    local_8[2] = 0;
    local_8[3] = 0;
    *(undefined8 *)(local_8 + 4) = 0;
    *(undefined8 *)(local_8 + 6) = 0;
    *(undefined8 *)(local_8 + 8) = 0;
    *(undefined8 *)(local_8 + 10) = 0;
    *(undefined1 *)(local_8 + 0xc) = 5;
    *(undefined1 *)((long)local_8 + 0x31) = 0xff;
    *(undefined1 *)((long)local_8 + 0x32) = 0xff;
    *(undefined8 *)(local_8 + 0xe) = 0;
    *(undefined8 *)(local_8 + 0x10) = 0;
    memset(local_8 + 0x12,0,0x200);
    memset(local_8 + 0x92,0,0x17c);
  }
  return local_8;
}

Assistant:

void * resampler_create(void)
{
    resampler * r = ( resampler * ) malloc( sizeof(resampler) );
    if ( !r ) return 0;

    r->write_pos = SINC_WIDTH - 1;
    r->write_filled = 0;
    r->read_pos = 0;
    r->read_filled = 0;
    r->phase.quad = 0;
    r->phase_inc.quad = 0;
    r->inv_phase.quad = 0;
    r->inv_phase_inc.quad = 0;
    r->quality = RESAMPLER_QUALITY_MAX;
    r->delay_added = -1;
    r->delay_removed = -1;
    r->last_amp = 0;
    r->accumulator = 0;
    memset( r->buffer_in, 0, sizeof(r->buffer_in) );
    memset( r->buffer_out, 0, sizeof(r->buffer_out) );

    return r;
}